

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

QString * __thiscall
ProjectBuilderMakefileGenerator::keyFor
          (QString *__return_storage_ptr__,ProjectBuilderMakefileGenerator *this,QString *block)

{
  QMakeProject *this_00;
  Data *pDVar1;
  Data<QHashPrivate::Node<QString,_QString>_> *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  bool bVar6;
  Node<QString,_QString> *pNVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QStringView config;
  QArrayData *local_a0;
  Algorithm local_98;
  storage_type *local_90;
  QString local_88;
  QString local_70;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
  QVar8.m_data = (storage_type *)0xf;
  QVar8.m_size = (qsizetype)local_58;
  QString::fromUtf8(QVar8);
  uVar5 = local_58._0_8_;
  config.m_data = (storage_type_conflict *)local_58._8_8_;
  config.m_size = local_58._16_8_;
  bVar6 = QMakeEvaluator::isActiveConfig(&this_00->super_QMakeEvaluator,config,false);
  if ((Data<QHashPrivate::Node<QString,_QString>_> *)uVar5 !=
      (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
    }
  }
  if (bVar6) {
    pDVar1 = (block->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (block->d).ptr;
    (__return_storage_ptr__->d).size = (block->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pDVar2 = (this->keys).d;
    if (pDVar2 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
      pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::findNode<QString>
                         (pDVar2,block);
      if (pNVar7 != (Node<QString,_QString> *)0x0) {
        QHash<QString,QString>::tryEmplace_impl<QString_const&>
                  ((TryEmplaceResult *)local_58,(QHash<QString,QString> *)&this->keys,block);
        QString::operator=(__return_storage_ptr__,
                           (QString *)
                           ((((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].
                             entries)->storage).data +
                           (ulong)((uint)(*(Span **)(local_58._0_8_ + 0x20))
                                         [(ulong)local_58._8_8_ >> 7].offsets
                                         [(uint)local_58._8_8_ & 0x7f] * 0x30) + 0x18));
        goto LAB_00140f30;
      }
    }
    QString::toUtf8_helper((QString *)&local_a0);
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QVar9.m_data = local_90;
    QVar9.m_size = (qsizetype)local_58;
    QCryptographicHash::hash(QVar9,local_98);
    QByteArray::toHex((char)&local_70);
    QVar10.m_data = (storage_type *)local_70.d.size;
    QVar10.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar10);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,0x10);
      }
    }
    if ((Data<QHashPrivate::Node<QString,_QString>_> *)local_58._0_8_ !=
        (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
      }
    }
    QString::left(&local_70,&local_88,0x18);
    QString::toUpper_helper((QString *)local_58);
    pDVar2 = (Data<QHashPrivate::Node<QString,_QString>_> *)(__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_58._0_8_;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_58._8_8_;
    qVar4 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58._16_8_;
    local_58._0_8_ = pDVar2;
    local_58._8_8_ = pcVar3;
    local_58._16_8_ = qVar4;
    if (pDVar2 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0) {
      LOCK();
      (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pDVar2,2,0x10);
      }
    }
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,1,0x10);
      }
    }
    QHash<QString,QString>::emplace<QString_const&>
              ((QHash<QString,QString> *)&this->keys,block,__return_storage_ptr__);
  }
LAB_00140f30:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
ProjectBuilderMakefileGenerator::keyFor(const QString &block)
{
#if 1 //This make this code much easier to debug..
    if(project->isActiveConfig("no_pb_munge_key"))
       return block;
#endif
    QString ret;
    if(!keys.contains(block)) {
        ret = qtSha1(block.toUtf8()).left(24).toUpper();
        keys.insert(block, ret);
    } else {
        ret = keys[block];
    }
    return ret;
}